

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inffast.c
# Opt level: O0

void inflate_fast(z_streamp strm,uint start)

{
  byte bVar1;
  uInt uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  internal_state *piVar6;
  uchar *puVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  ulg uVar11;
  uchar *puVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  Bytef *pBVar16;
  Bytef *pBVar17;
  Bytef *pBVar18;
  byte *pbVar19;
  uchar *puVar20;
  uInt local_d0;
  uInt local_c8;
  uchar *local_a8;
  uchar *from;
  uint local_98;
  uint dist;
  uint len;
  uint op;
  code *here;
  uint dmask;
  uint lmask;
  code *dcode;
  code *lcode;
  ulong uStack_68;
  uint bits;
  unsigned_long hold;
  uchar *window;
  uint wnext;
  uint whave;
  uint wsize;
  uchar *end;
  uchar *beg;
  uchar *out;
  uchar *last;
  uchar *in;
  inflate_state *state;
  uint start_local;
  z_streamp strm_local;
  
  piVar6 = strm->state;
  last = strm->next_in;
  pBVar16 = last + (strm->avail_in - 5);
  beg = strm->next_out;
  uVar2 = strm->avail_out;
  iVar10 = (int)beg;
  pBVar17 = beg + (strm->avail_out - 0x101);
  iVar3 = *(int *)((long)&piVar6->gzhead + 4);
  uVar11 = piVar6->gzindex;
  uVar15 = *(uint *)((long)&piVar6->gzindex + 4);
  puVar7 = *(uchar **)&piVar6->method;
  uStack_68 = *(ulong *)piVar6->crc0;
  lcode._4_4_ = piVar6->crc0[2];
  lVar8 = *(long *)(piVar6->crc0 + 6);
  lVar9 = *(long *)(piVar6->crc0 + 8);
  uVar4 = piVar6->crc0[10];
  uVar5 = piVar6->crc0[0xb];
LAB_00113361:
  if (lcode._4_4_ < 0xf) {
    pbVar19 = last + 1;
    bVar1 = *last;
    last = last + 2;
    uStack_68 = ((ulong)*pbVar19 << ((byte)lcode._4_4_ + 8 & 0x3f)) +
                ((ulong)bVar1 << ((byte)lcode._4_4_ & 0x3f)) + uStack_68;
    lcode._4_4_ = lcode._4_4_ + 0x10;
  }
  _len = (byte *)(lVar8 + (uStack_68 & (1 << ((byte)uVar4 & 0x1f)) - 1) * 4);
  while( true ) {
    uStack_68 = uStack_68 >> (_len[1] & 0x3f);
    lcode._4_4_ = lcode._4_4_ - _len[1];
    bVar1 = *_len;
    if (bVar1 == 0) break;
    if ((bVar1 & 0x10) != 0) {
      local_98 = (uint)*(ushort *)(_len + 2);
      uVar13 = bVar1 & 0xf;
      if ((bVar1 & 0xf) != 0) {
        if (lcode._4_4_ < uVar13) {
          uStack_68 = ((ulong)*last << ((byte)lcode._4_4_ & 0x3f)) + uStack_68;
          lcode._4_4_ = lcode._4_4_ + 8;
          last = last + 1;
        }
        local_98 = ((uint)uStack_68 & (1 << (sbyte)uVar13) - 1U) + local_98;
        uStack_68 = uStack_68 >> (sbyte)uVar13;
        lcode._4_4_ = lcode._4_4_ - uVar13;
      }
      if (lcode._4_4_ < 0xf) {
        pbVar19 = last + 1;
        bVar1 = *last;
        last = last + 2;
        uStack_68 = ((ulong)*pbVar19 << ((byte)lcode._4_4_ + 8 & 0x3f)) +
                    ((ulong)bVar1 << ((byte)lcode._4_4_ & 0x3f)) + uStack_68;
        lcode._4_4_ = lcode._4_4_ + 0x10;
      }
      _len = (byte *)(lVar9 + (uStack_68 & (1 << ((byte)uVar5 & 0x1f)) - 1) * 4);
      goto LAB_0011356b;
    }
    if ((bVar1 & 0x40) != 0) {
      if ((bVar1 & 0x20) == 0) {
        strm->msg = "invalid literal/length code";
        piVar6->status = 0x3f51;
      }
      else {
        piVar6->status = 0x3f3f;
      }
      goto LAB_00113ce6;
    }
    _len = (byte *)(lVar8 + (long)(int)(uint)*(ushort *)(_len + 2) * 4 +
                   (uStack_68 & (1 << (bVar1 & 0x1f)) - 1) * 4);
  }
  *beg = (uchar)*(undefined2 *)(_len + 2);
  puVar20 = beg + 1;
  goto LAB_00113cb3;
LAB_0011356b:
  uStack_68 = uStack_68 >> (_len[1] & 0x3f);
  uVar13 = lcode._4_4_ - _len[1];
  bVar1 = *_len;
  lcode._4_4_ = uVar13;
  if ((bVar1 & 0x10) != 0) goto code_r0x001135bf;
  if ((bVar1 & 0x40) != 0) {
    strm->msg = "invalid distance code";
    piVar6->status = 0x3f51;
    goto LAB_00113ce6;
  }
  _len = (byte *)(lVar9 + (long)(int)(uint)*(ushort *)(_len + 2) * 4 +
                 (uStack_68 & (1 << (bVar1 & 0x1f)) - 1) * 4);
  goto LAB_0011356b;
code_r0x001135bf:
  uVar14 = bVar1 & 0xf;
  pbVar19 = last;
  if (uVar13 < uVar14) {
    uStack_68 = ((ulong)*last << ((byte)uVar13 & 0x3f)) + uStack_68;
    lcode._4_4_ = uVar13 + 8;
    pbVar19 = last + 1;
    if (lcode._4_4_ < uVar14) {
      uStack_68 = ((ulong)last[1] << ((byte)lcode._4_4_ & 0x3f)) + uStack_68;
      lcode._4_4_ = uVar13 + 0x10;
      pbVar19 = last + 2;
    }
  }
  last = pbVar19;
  uVar13 = ((uint)uStack_68 & (1 << (sbyte)uVar14) - 1U) + (uint)*(ushort *)(_len + 2);
  uStack_68 = uStack_68 >> (sbyte)uVar14;
  lcode._4_4_ = lcode._4_4_ - uVar14;
  uVar14 = (int)beg - (iVar10 - (start - uVar2));
  if (uVar14 < uVar13) {
    dist = uVar13 - uVar14;
    if (((uint)uVar11 < dist) && (piVar6[1].d_desc.max_code != 0)) {
      strm->msg = "invalid distance too far back";
      piVar6->status = 0x3f51;
      goto LAB_00113ce6;
    }
    if (uVar15 == 0) {
      local_a8 = puVar7 + (iVar3 - dist);
      if (dist < local_98) {
        local_98 = local_98 - dist;
        do {
          puVar20 = beg + 1;
          *beg = *local_a8;
          dist = dist - 1;
          local_a8 = local_a8 + 1;
          beg = puVar20;
        } while (dist != 0);
        local_a8 = puVar20 + -(ulong)uVar13;
      }
    }
    else if (uVar15 < dist) {
      uVar14 = (iVar3 + uVar15) - dist;
      dist = dist - uVar15;
      local_a8 = puVar7 + uVar14;
      if (dist < local_98) {
        local_98 = local_98 - dist;
        do {
          puVar20 = beg + 1;
          *beg = *local_a8;
          dist = dist - 1;
          local_a8 = local_a8 + 1;
          beg = puVar20;
        } while (dist != 0);
        local_a8 = puVar7;
        if (uVar15 < local_98) {
          local_98 = local_98 - uVar15;
          dist = uVar15;
          do {
            puVar20 = beg + 1;
            *beg = *local_a8;
            dist = dist - 1;
            local_a8 = local_a8 + 1;
            beg = puVar20;
          } while (dist != 0);
          local_a8 = puVar20 + -(ulong)uVar13;
        }
      }
    }
    else {
      local_a8 = puVar7 + (uVar15 - dist);
      if (dist < local_98) {
        local_98 = local_98 - dist;
        do {
          puVar20 = beg + 1;
          *beg = *local_a8;
          dist = dist - 1;
          local_a8 = local_a8 + 1;
          beg = puVar20;
        } while (dist != 0);
        local_a8 = puVar20 + -(ulong)uVar13;
      }
    }
    for (; 2 < local_98; local_98 = local_98 - 3) {
      *beg = *local_a8;
      beg[1] = local_a8[1];
      beg[2] = local_a8[2];
      local_a8 = local_a8 + 3;
      beg = beg + 3;
    }
    puVar20 = beg;
    if (local_98 != 0) {
      *beg = *local_a8;
      puVar20 = beg + 1;
      if (1 < local_98) {
        beg[1] = local_a8[1];
        puVar20 = beg + 2;
      }
    }
  }
  else {
    puVar12 = beg + -(ulong)uVar13;
    puVar20 = beg;
    do {
      beg = puVar20;
      local_a8 = puVar12;
      *beg = *local_a8;
      beg[1] = local_a8[1];
      puVar20 = beg + 3;
      beg[2] = local_a8[2];
      local_98 = local_98 - 3;
      puVar12 = local_a8 + 3;
    } while (2 < local_98);
    if (local_98 != 0) {
      *puVar20 = local_a8[3];
      puVar20 = beg + 4;
      if (1 < local_98) {
        beg[4] = local_a8[4];
        puVar20 = beg + 5;
      }
    }
  }
LAB_00113cb3:
  beg = puVar20;
  if (pBVar16 <= last || pBVar17 <= beg) {
LAB_00113ce6:
    pBVar18 = last + -(ulong)(lcode._4_4_ >> 3);
    uVar15 = lcode._4_4_ + (lcode._4_4_ >> 3) * -8;
    strm->next_in = pBVar18;
    strm->next_out = beg;
    if (pBVar18 < pBVar16) {
      iVar3 = (int)pBVar16 - (int)pBVar18;
    }
    else {
      iVar3 = -((int)pBVar18 - (int)pBVar16);
    }
    local_c8 = iVar3 + 5;
    strm->avail_in = local_c8;
    if (beg < pBVar17) {
      iVar3 = (int)pBVar17 - (int)beg;
    }
    else {
      iVar3 = -((int)beg - (int)pBVar17);
    }
    local_d0 = iVar3 + 0x101;
    strm->avail_out = local_d0;
    *(ulong *)piVar6->crc0 = (1 << ((byte)uVar15 & 0x1f)) - 1 & uStack_68;
    piVar6->crc0[2] = uVar15;
    return;
  }
  goto LAB_00113361;
}

Assistant:

void ZLIB_INTERNAL inflate_fast(z_streamp strm, unsigned start) {
    struct inflate_state FAR *state;
    z_const unsigned char FAR *in;      /* local strm->next_in */
    z_const unsigned char FAR *last;    /* have enough input while in < last */
    unsigned char FAR *out;     /* local strm->next_out */
    unsigned char FAR *beg;     /* inflate()'s initial strm->next_out */
    unsigned char FAR *end;     /* while out < end, enough space available */
#ifdef INFLATE_STRICT
    unsigned dmax;              /* maximum distance from zlib header */
#endif
    unsigned wsize;             /* window size or zero if not using window */
    unsigned whave;             /* valid bytes in the window */
    unsigned wnext;             /* window write index */
    unsigned char FAR *window;  /* allocated sliding window, if wsize != 0 */
    unsigned long hold;         /* local strm->hold */
    unsigned bits;              /* local strm->bits */
    code const FAR *lcode;      /* local strm->lencode */
    code const FAR *dcode;      /* local strm->distcode */
    unsigned lmask;             /* mask for first level of length codes */
    unsigned dmask;             /* mask for first level of distance codes */
    code const *here;           /* retrieved table entry */
    unsigned op;                /* code bits, operation, extra bits, or */
                                /*  window position, window bytes to copy */
    unsigned len;               /* match length, unused bytes */
    unsigned dist;              /* match distance */
    unsigned char FAR *from;    /* where to copy match from */

    /* copy state to local variables */
    state = (struct inflate_state FAR *)strm->state;
    in = strm->next_in;
    last = in + (strm->avail_in - (INFLATE_FAST_MIN_INPUT - 1));
    out = strm->next_out;
    beg = out - (start - strm->avail_out);
    end = out + (strm->avail_out - (INFLATE_FAST_MIN_OUTPUT - 1));
#ifdef INFLATE_STRICT
    dmax = state->dmax;
#endif
    wsize = state->wsize;
    whave = state->whave;
    wnext = state->wnext;
    window = state->window;
    hold = state->hold;
    bits = state->bits;
    lcode = state->lencode;
    dcode = state->distcode;
    lmask = (1U << state->lenbits) - 1;
    dmask = (1U << state->distbits) - 1;

    /* decode literals and length/distances until end-of-block or not enough
       input data or output space */
    do {
        if (bits < 15) {
            hold += (unsigned long)(*in++) << bits;
            bits += 8;
            hold += (unsigned long)(*in++) << bits;
            bits += 8;
        }
        here = lcode + (hold & lmask);
      dolen:
        op = (unsigned)(here->bits);
        hold >>= op;
        bits -= op;
        op = (unsigned)(here->op);
        if (op == 0) {                          /* literal */
            Tracevv((stderr, here->val >= 0x20 && here->val < 0x7f ?
                    "inflate:         literal '%c'\n" :
                    "inflate:         literal 0x%02x\n", here->val));
            *out++ = (unsigned char)(here->val);
        }
        else if (op & 16) {                     /* length base */
            len = (unsigned)(here->val);
            op &= 15;                           /* number of extra bits */
            if (op) {
                if (bits < op) {
                    hold += (unsigned long)(*in++) << bits;
                    bits += 8;
                }
                len += (unsigned)hold & ((1U << op) - 1);
                hold >>= op;
                bits -= op;
            }
            Tracevv((stderr, "inflate:         length %u\n", len));
            if (bits < 15) {
                hold += (unsigned long)(*in++) << bits;
                bits += 8;
                hold += (unsigned long)(*in++) << bits;
                bits += 8;
            }
            here = dcode + (hold & dmask);
          dodist:
            op = (unsigned)(here->bits);
            hold >>= op;
            bits -= op;
            op = (unsigned)(here->op);
            if (op & 16) {                      /* distance base */
                dist = (unsigned)(here->val);
                op &= 15;                       /* number of extra bits */
                if (bits < op) {
                    hold += (unsigned long)(*in++) << bits;
                    bits += 8;
                    if (bits < op) {
                        hold += (unsigned long)(*in++) << bits;
                        bits += 8;
                    }
                }
                dist += (unsigned)hold & ((1U << op) - 1);
#ifdef INFLATE_STRICT
                if (dist > dmax) {
                    strm->msg = (char *)"invalid distance too far back";
                    state->mode = BAD;
                    break;
                }
#endif
                hold >>= op;
                bits -= op;
                Tracevv((stderr, "inflate:         distance %u\n", dist));
                op = (unsigned)(out - beg);     /* max distance in output */
                if (dist > op) {                /* see if copy from window */
                    op = dist - op;             /* distance back in window */
                    if (op > whave) {
                        if (state->sane) {
                            strm->msg =
                                (char *)"invalid distance too far back";
                            state->mode = BAD;
                            break;
                        }
#ifdef INFLATE_ALLOW_INVALID_DISTANCE_TOOFAR_ARRR
                        if (len <= op - whave) {
                            do {
                                *out++ = 0;
                            } while (--len);
                            continue;
                        }
                        len -= op - whave;
                        do {
                            *out++ = 0;
                        } while (--op > whave);
                        if (op == 0) {
                            from = out - dist;
                            do {
                                *out++ = *from++;
                            } while (--len);
                            continue;
                        }
#endif
                    }
                    from = window;
                    if (wnext == 0) {           /* very common case */
                        from += wsize - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    else if (wnext < op) {      /* wrap around window */
                        from += wsize + wnext - op;
                        op -= wnext;
                        if (op < len) {         /* some from end of window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = window;
                            if (wnext < len) {  /* some from start of window */
                                op = wnext;
                                len -= op;
                                do {
                                    *out++ = *from++;
                                } while (--op);
                                from = out - dist;      /* rest from output */
                            }
                        }
                    }
                    else {                      /* contiguous in window */
                        from += wnext - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    while (len > 2) {
                        *out++ = *from++;
                        *out++ = *from++;
                        *out++ = *from++;
                        len -= 3;
                    }
                    if (len) {
                        *out++ = *from++;
                        if (len > 1)
                            *out++ = *from++;
                    }
                }
                else {
                    from = out - dist;          /* copy direct from output */
                    do {                        /* minimum length is three */
                        *out++ = *from++;
                        *out++ = *from++;
                        *out++ = *from++;
                        len -= 3;
                    } while (len > 2);
                    if (len) {
                        *out++ = *from++;
                        if (len > 1)
                            *out++ = *from++;
                    }
                }
            }
            else if ((op & 64) == 0) {          /* 2nd level distance code */
                here = dcode + here->val + (hold & ((1U << op) - 1));
                goto dodist;
            }
            else {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
        }
        else if ((op & 64) == 0) {              /* 2nd level length code */
            here = lcode + here->val + (hold & ((1U << op) - 1));
            goto dolen;
        }
        else if (op & 32) {                     /* end-of-block */
            Tracevv((stderr, "inflate:         end of block\n"));
            state->mode = TYPE;
            break;
        }
        else {
            strm->msg = (char *)"invalid literal/length code";
            state->mode = BAD;
            break;
        }
    } while (in < last && out < end);

    /* return unused bytes (on entry, bits < 8, so in won't go too far back) */
    len = bits >> 3;
    in -= len;
    bits -= len << 3;
    hold &= (1U << bits) - 1;

    /* update state and return */
    strm->next_in = in;
    strm->next_out = out;
    strm->avail_in = (unsigned)(in < last ?
        (INFLATE_FAST_MIN_INPUT - 1) + (last - in) :
        (INFLATE_FAST_MIN_INPUT - 1) - (in - last));
    strm->avail_out = (unsigned)(out < end ?
        (INFLATE_FAST_MIN_OUTPUT - 1) + (end - out) :
        (INFLATE_FAST_MIN_OUTPUT - 1) - (out - end));
    state->hold = hold;
    state->bits = bits;
    return;
}